

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhstsstore.cpp
# Opt level: O2

bool __thiscall QHstsStore::deserializePolicy(QHstsStore *this,QString *key,QHstsPolicy *policy)

{
  char cVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QAnyStringView QVar3;
  bool includesSubDomains;
  qint64 expiryInMS;
  QDateTime local_a0 [15];
  bool local_91;
  longlong local_90;
  QArrayDataPointer<char> local_88;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined8 local_58;
  undefined1 *puStack_50;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QVar3.m_size = (size_t)&this->store;
  QVar3.field_0.m_data = &local_48;
  QSettings::value(QVar3);
  cVar1 = QVariant::isNull();
  if (cVar1 == '\0') {
    bVar2 = QVariant::canConvert<QByteArray>((QVariant *)&local_48);
    if (bVar2) {
      local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_88.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_88.ptr = &DAT_aaaaaaaaaaaaaaaa;
      QVariant::toByteArray();
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
      QDataStream::QDataStream((QDataStream *)&local_68,(QByteArray *)&local_88);
      local_90 = 0;
      QDataStream::operator>>((QDataStream *)&local_68,&local_90);
      if (local_58._3_1_ == '\0') {
        local_91 = false;
        QDataStream::operator>>((QDataStream *)&local_68,&local_91);
        bVar2 = local_58._3_1_ == '\0';
        if (bVar2) {
          QDateTime::fromMSecsSinceEpoch((longlong)local_a0);
          QHstsPolicy::setExpiry(policy,local_a0);
          QDateTime::~QDateTime(local_a0);
          QHstsPolicy::setIncludesSubDomains(policy,local_91);
        }
      }
      else {
        bVar2 = false;
      }
      QDataStream::~QDataStream((QDataStream *)&local_68);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_88);
      goto LAB_001c9464;
    }
  }
  bVar2 = false;
LAB_001c9464:
  QVariant::~QVariant((QVariant *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QHstsStore::deserializePolicy(const QString &key, QHstsPolicy &policy)
{
    Q_ASSERT(store.contains(key));

    const QVariant data(store.value(key));
    if (data.isNull() || !data.canConvert<QByteArray>())
        return false;

    const QByteArray serializedData(data.toByteArray());
    QDataStream streamer(serializedData);
    qint64 expiryInMS = 0;
    streamer >> expiryInMS;
    if (streamer.status() != QDataStream::Ok)
        return false;
    bool includesSubDomains = false;
    streamer >> includesSubDomains;
    if (streamer.status() != QDataStream::Ok)
        return false;

    policy.setExpiry(QDateTime::fromMSecsSinceEpoch(expiryInMS));
    policy.setIncludesSubDomains(includesSubDomains);

    return true;
}